

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall Edge::GetBindingBool(Edge *this,string *key)

{
  string local_30;
  
  GetBinding(&local_30,this,key);
  std::__cxx11::string::~string((string *)&local_30);
  return local_30._M_string_length != 0;
}

Assistant:

bool Edge::GetBindingBool(const string& key) const {
  return !GetBinding(key).empty();
}